

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_symbols.cxx
# Opt level: O3

void rectangle(double x,double y,double x2,double y2,Fl_Color col)

{
  Fl_Color FVar1;
  
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,col);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1b])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(x,y);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(x2,y);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(x2,y2);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(x,y2);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x25])();
  FVar1 = fl_color_average(col,0x38,0.67);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar1);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1a])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(x,y);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(x2,y);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(x2,y2);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1c])(x,y2);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x24])();
  return;
}

Assistant:

static void rectangle(double x,double y,double x2,double y2,Fl_Color col) {
  fl_color(col);
  BP; vv(x,y); vv(x2,y); vv(x2,y2); vv(x,y2); EP;
  set_outline_color(col);
  BC; vv(x,y); vv(x2,y); vv(x2,y2); vv(x,y2); EC;
}